

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

void __thiscall czh::node::Node::Node(Node *this,Node *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  variant_alternative_t<0UL,_variant<NodeData,_Value>_> *pvVar8;
  _List_node_base *p_Var9;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (node->name)._M_dataplus._M_p;
  paVar2 = &(node->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(node->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = (node->name)._M_string_length;
  (node->name)._M_dataplus._M_p = (pointer)paVar2;
  (node->name)._M_string_length = 0;
  (node->name).field_2._M_local_buf[0] = '\0';
  this->last_node = node->last_node;
  std::__detail::__variant::_Move_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value>::
  _Move_ctor_base((_Move_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value> *)
                  &this->data,
                  (_Move_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value> *)
                  &node->data);
  (this->czh_token).type = (node->czh_token).type;
  std::__detail::__variant::
  _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&(this->czh_token).what,
                    (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&(node->czh_token).what);
  sVar5 = (node->czh_token).pos.size;
  (this->czh_token).pos.pos = (node->czh_token).pos.pos;
  (this->czh_token).pos.size = sVar5;
  (this->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6 = (node->czh_token).pos.code.
           super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (node->czh_token).pos.code.
           super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (node->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  (this->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  (node->czh_token).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  if (*(__index_type *)
       ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) ==
      '\0') {
    pvVar8 = std::get<0ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
    for (p_Var9 = (pvVar8->nodes).
                  super__List_base<czh::node::Node,_std::allocator<czh::node::Node>_>._M_impl.
                  _M_node.super__List_node_base._M_next; p_Var9 != (_List_node_base *)&pvVar8->nodes
        ; p_Var9 = p_Var9->_M_next) {
      p_Var9[3]._M_next = (_List_node_base *)this;
    }
  }
  return;
}

Assistant:

Node(Node &&node)
        : name(std::move(node.name)), last_node(std::move(node.last_node)), czh_token(std::move(node.czh_token)),
          data(std::move(node.data))
    {
      if (is_node())
      {
        auto &nd = std::get<NodeData>(data);
        for (auto &r: nd.nodes)
        {
          r.last_node = this;
        }
      }
    }